

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O3

void __thiscall CppUnit::PlugInManager::removeListener(PlugInManager *this,TestResult *eventManager)

{
  _Map_pointer ppPVar1;
  _Elt_pointer pPVar2;
  _Elt_pointer pPVar3;
  
  pPVar3 = (this->m_plugIns).
           super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (pPVar3 != (this->m_plugIns).
                super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pPVar2 = (this->m_plugIns).
             super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppPVar1 = (this->m_plugIns).
              super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*pPVar3->m_interface->_vptr_CppUnitTestPlugIn[2])(pPVar3->m_interface,eventManager);
      pPVar3 = pPVar3 + 1;
      if (pPVar3 == pPVar2) {
        pPVar3 = ppPVar1[1];
        ppPVar1 = ppPVar1 + 1;
        pPVar2 = pPVar3 + 10;
      }
    } while (pPVar3 != (this->m_plugIns).
                       super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return;
}

Assistant:

void 
PlugInManager::removeListener( TestResult *eventManager )
{
  for ( PlugIns::iterator it = m_plugIns.begin(); it != m_plugIns.end(); ++it )
    (*it).m_interface->removeListener( eventManager );
}